

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap12_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  FT_UInt32 d;
  FT_ULong last;
  FT_ULong start_id;
  FT_ULong end;
  FT_ULong start;
  FT_ULong n;
  FT_ULong num_groups;
  FT_ULong length;
  FT_Byte *p;
  FT_Validator valid_local;
  FT_Byte *table_local;
  
  if (valid->limit < table + 0x10) {
    ft_validator_error(valid,8);
  }
  uVar8 = (ulong)((uint)table[4] << 0x18 | (uint)table[5] << 0x10 | (uint)table[6] << 8 |
                 (uint)table[7]);
  uVar9 = (ulong)((uint)table[0xc] << 0x18 | (uint)table[0xd] << 0x10 | (uint)table[0xe] << 8 |
                 (uint)table[0xf]);
  if ((((ulong)((long)valid->limit - (long)table) < uVar8) || (uVar8 < 0x10)) ||
     ((uVar8 - 0x10) / 0xc < uVar9)) {
    ft_validator_error(valid,8);
  }
  length = (FT_ULong)(table + 0x10);
  uVar5 = 0;
  for (start = 0; start < uVar9; start = start + 1) {
    uVar6 = (uint)*(byte *)length << 0x18 | (uint)*(byte *)(length + 1) << 0x10 |
            (uint)*(byte *)(length + 2) << 8 | (uint)*(byte *)(length + 3);
    uVar7 = (uint)*(byte *)(length + 4) << 0x18 | (uint)*(byte *)(length + 5) << 0x10 |
            (uint)*(byte *)(length + 6) << 8 | (uint)*(byte *)(length + 7);
    bVar1 = *(byte *)(length + 8);
    bVar2 = *(byte *)(length + 9);
    bVar3 = *(byte *)(length + 10);
    bVar4 = *(byte *)(length + 0xb);
    if (uVar7 < uVar6) {
      ft_validator_error(valid,8);
    }
    if ((start != 0) && (uVar6 <= uVar5)) {
      ft_validator_error(valid,8);
    }
    if ((valid->level != FT_VALIDATE_DEFAULT) &&
       (((uint)valid[1].jump_buffer[0].__jmpbuf[0] < uVar7 - uVar6 ||
        ((int)valid[1].jump_buffer[0].__jmpbuf[0] - (uVar7 - uVar6) <=
         ((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4))))) {
      ft_validator_error(valid,0x10);
    }
    length = length + 0xc;
    uVar5 = uVar7;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap12_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_groups;


    if ( table + 16 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 4;
    length = TT_NEXT_ULONG( p );

    p          = table + 12;
    num_groups = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 16 + 12 * num_groups ? */
         length < 16                                 ||
         ( length - 16 ) / 12 < num_groups           )
      FT_INVALID_TOO_SHORT;

    /* check groups, they must be in increasing order */
    {
      FT_ULong  n, start, end, start_id, last = 0;


      for ( n = 0; n < num_groups; n++ )
      {
        start    = TT_NEXT_ULONG( p );
        end      = TT_NEXT_ULONG( p );
        start_id = TT_NEXT_ULONG( p );

        if ( start > end )
          FT_INVALID_DATA;

        if ( n > 0 && start <= last )
          FT_INVALID_DATA;

        if ( valid->level >= FT_VALIDATE_TIGHT )
        {
          FT_UInt32  d = end - start;


          /* start_id + end - start >= TT_VALID_GLYPH_COUNT( valid ) ? */
          if ( d > TT_VALID_GLYPH_COUNT( valid )             ||
               start_id >= TT_VALID_GLYPH_COUNT( valid ) - d )
            FT_INVALID_GLYPH_ID;
        }

        last = end;
      }
    }

    return FT_Err_Ok;
  }